

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall Json::OurReader::readCStyleComment(OurReader *this,bool *containsNewLineResult)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char cVar4;
  
  *containsNewLineResult = false;
  pcVar2 = this->end_;
  pcVar3 = this->current_;
  do {
    while( true ) {
      pcVar1 = pcVar3 + 1;
      if (pcVar2 <= pcVar1) goto LAB_0060d4e3;
      if (pcVar3 == pcVar2) {
        cVar4 = '\0';
      }
      else {
        this->current_ = pcVar1;
        cVar4 = *pcVar3;
        pcVar3 = pcVar1;
      }
      if (cVar4 != '\n') break;
      *containsNewLineResult = true;
    }
  } while ((cVar4 != '*') || (*pcVar3 != '/'));
LAB_0060d4e3:
  pcVar3 = this->current_;
  if (pcVar3 != pcVar2) {
    this->current_ = pcVar3 + 1;
    return *pcVar3 == '/';
  }
  return false;
}

Assistant:

bool OurReader::readCStyleComment(bool* containsNewLineResult) {
  *containsNewLineResult = false;

  while ((current_ + 1) < end_) {
    Char c = getNextChar();
    if (c == '*' && *current_ == '/')
      break;
    if (c == '\n')
      *containsNewLineResult = true;
  }

  return getNextChar() == '/';
}